

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O0

ON_SubDComponentRef * __thiscall
ON_SubDComponentRefList::Append
          (ON_SubDComponentRefList *this,ON_SubDRef *subd_ref,ON_COMPONENT_INDEX ci,
          ON_SubDComponentLocation component_location,ON__UINT_PTR reference_id)

{
  bool bVar1;
  ON_SubD *this_00;
  undefined1 local_78 [8];
  ON_SubDComponentRef r;
  ON__UINT_PTR reference_id_local;
  ON_SubDComponentLocation component_location_local;
  ON_SubDRef *subd_ref_local;
  ON_SubDComponentRefList *this_local;
  ON_COMPONENT_INDEX ci_local;
  
  r.m_reference_id = reference_id;
  this_local = (ON_SubDComponentRefList *)ci;
  this_00 = ON_SubDRef::SubD(subd_ref);
  bVar1 = ON_SubD::IsEmpty(this_00);
  if ((bVar1) ||
     (bVar1 = ON_COMPONENT_INDEX::IsSubDComponentIndex((ON_COMPONENT_INDEX *)&this_local), !bVar1))
  {
    ci_local = (ON_COMPONENT_INDEX)&ON_SubDComponentRef::Empty;
  }
  else {
    ON_SubDComponentRef::Create
              ((ON_SubDComponentRef *)local_78,subd_ref,(ON_COMPONENT_INDEX)this_local,
               component_location,r.m_reference_id);
    ci_local = (ON_COMPONENT_INDEX)Append(this,(ON_SubDComponentRef *)local_78);
    ON_SubDComponentRef::~ON_SubDComponentRef((ON_SubDComponentRef *)local_78);
  }
  return (ON_SubDComponentRef *)ci_local;
}

Assistant:

const ON_SubDComponentRef& ON_SubDComponentRefList::Append(
  const ON_SubDRef & subd_ref,
  ON_COMPONENT_INDEX ci, 
  ON_SubDComponentLocation component_location,
  ON__UINT_PTR reference_id
  )
{
  for (;;)
  {
    if (subd_ref.SubD().IsEmpty())
      break;
    if (false == ci.IsSubDComponentIndex())
      break;
    const ON_SubDComponentRef r(ON_SubDComponentRef::Create(subd_ref, ci, component_location, reference_id));
    return Append(&r);
  }
  return ON_SubDComponentRef::Empty;
}